

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

string * toml::detail::make_string_abi_cxx11_(size_t len,char c)

{
  undefined1 in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  allocator<char> *__a;
  undefined8 in_stack_ffffffffffffffc0;
  char __c;
  string *this;
  allocator<char> local_25 [5];
  allocator<char> *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  
  __c = (char)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  if (in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,(char *)CONCAT17(in_DL,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffee);
    this = in_RDI;
  }
  else {
    __a = local_25;
    this = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(size_type)in_RDI,__c,__a);
    std::allocator<char>::~allocator(local_25);
  }
  return this;
}

Assistant:

inline std::string make_string(std::size_t len, char c)
{
    if(len == 0) {return "";}
    return std::string(len, c);
}